

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx512::forward
          (Yolov3DetectionOutput_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint *puVar1;
  undefined4 uVar2;
  size_t sVar3;
  void *pvVar4;
  ulong uVar5;
  Mat *this_00;
  int iVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  int iVar12;
  uint *puVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pBVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  _func_int *p_Var20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  pointer pMVar25;
  float *pfVar26;
  int i;
  int iVar27;
  float *pfVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 extraout_var [60];
  undefined1 auVar45 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined8 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_1a8;
  float *local_1a0;
  uint *local_198;
  int local_190;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar21 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar21) {
      Yolov3DetectionOutput::qsort_descent_inplace
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx512 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]),&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx512 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]),&all_bbox_rects,&picked,
                 *(float *)(&this->field_0xdc +
                           (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]));
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar21 = 0;
          uVar21 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
          uVar21 = uVar21 + 1) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)(CONCAT44(picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar21 * 8
                             ));
      }
      uVar21 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar27 = (int)uVar21;
      if (iVar27 == 0) {
        iVar12 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar27,4,opt->blob_allocator);
        pvVar4 = this_00->data;
        iVar12 = -100;
        if ((pvVar4 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar12 = 0;
          uVar21 = uVar21 & 0xffffffff;
          if (iVar27 < 1) {
            uVar21 = 0;
          }
          pBVar16 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
            fVar33 = pBVar16->score;
            lVar22 = (long)this_00->w * uVar19 * this_00->elemsize;
            *(float *)((long)pvVar4 + lVar22) = (float)pBVar16->label + 1.0;
            *(float *)((long)pvVar4 + lVar22 + 4) = fVar33;
            *(float *)((long)pvVar4 + lVar22 + 8) = pBVar16->xmin;
            *(float *)((long)pvVar4 + lVar22 + 0xc) = pBVar16->ymin;
            *(float *)((long)pvVar4 + lVar22 + 0x10) = pBVar16->xmax;
            *(float *)((long)pvVar4 + lVar22 + 0x14) = pBVar16->ymax;
            pBVar16 = pBVar16 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_003eff44:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar12;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,
             (long)*(int *)(&this->field_0xd4 +
                           (long)this->_vptr_Yolov3DetectionOutput_x86_avx512[-3]));
    pMVar25 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    p_Var20 = this->_vptr_Yolov3DetectionOutput_x86_avx512[-3];
    iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var20);
    iVar12 = pMVar25[uVar21].c / iVar27;
    if (iVar12 != *(int *)(&this->field_0xd0 + (long)p_Var20) + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar12 = -1;
      goto LAB_003eff44;
    }
    pMVar25 = pMVar25 + uVar21;
    lVar22 = (long)iVar27;
    uVar19._0_4_ = pMVar25->w;
    uVar19._4_4_ = pMVar25->h;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar19;
    auVar37 = vcvtdq2ps_avx(auVar37);
    uVar2 = *(undefined4 *)(*(long *)(&this->field_0x170 + (long)p_Var20) + uVar21 * 4);
    auVar29._4_4_ = uVar2;
    auVar29._0_4_ = uVar2;
    auVar29._8_4_ = uVar2;
    auVar29._12_4_ = uVar2;
    auVar29 = vmulps_avx512vl(auVar37,auVar29);
    auVar29 = vroundps_avx(auVar29,0xb);
    uVar17 = 0;
    if (0 < (int)(undefined4)uVar19) {
      uVar17 = uVar19 & 0xffffffff;
    }
    uVar23 = uVar19 >> 0x20;
    if (uVar19._4_4_ == 0 || (long)uVar19 < 0) {
      uVar23 = 0;
    }
    auVar43._0_12_ = ZEXT412(0x3f000000) << 0x40;
    auVar43._12_4_ = 0x3f000000;
    auVar44._8_8_ = auVar43._8_8_;
    auVar44._0_8_ = auVar37._0_8_;
    auVar43 = vrcpps_avx(auVar44);
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    auVar30 = vfmsub213ps_avx512vl(auVar43,auVar44,auVar30);
    auVar43 = vfnmadd132ps_fma(auVar30,auVar43,auVar43);
    for (lVar18 = 0; lVar18 < iVar27; lVar18 = lVar18 + 1) {
      lVar24 = lVar18 * iVar12;
      sVar3 = pMVar25->cstep;
      pvVar4 = pMVar25->data;
      uVar5 = pMVar25->elemsize;
      pfVar28 = (float *)(sVar3 * lVar24 * uVar5 + (long)pvVar4);
      local_198 = (uint *)((lVar24 + 1) * sVar3 * uVar5 + (long)pvVar4);
      local_1a0 = (float *)((lVar24 + 2) * sVar3 * uVar5 + (long)pvVar4);
      local_1a8 = (float *)((lVar24 + 3) * sVar3 * uVar5 + (long)pvVar4);
      pfVar26 = (float *)((lVar24 + 4) * sVar3 * uVar5 + (long)pvVar4);
      auVar31 = vpbroadcastd_avx512vl();
      auVar30 = vpmulld_avx(auVar31,_DAT_004f1b30);
      auVar44 = vpmulld_avx(auVar31,_DAT_004f1b40);
      auVar32 = vpexpandd_avx512vl(ZEXT1632(auVar31));
      auVar7 = vpermq_avx2(ZEXT1632(auVar30),0xd0);
      auVar7 = vpblendd_avx2(auVar7,ZEXT432(auVar32._4_4_) << 0x20,3);
      uVar48 = auVar44._0_8_;
      auVar32._8_8_ = uVar48;
      auVar32._0_8_ = uVar48;
      auVar32._16_8_ = uVar48;
      auVar32._24_8_ = uVar48;
      auVar47 = ZEXT3264(auVar32);
      vpblendd_avx2(auVar7,auVar32,0xc0);
      iVar27 = (int)(((long)pMVar25->d * uVar5 * (long)pMVar25->h * (long)pMVar25->w + 0xf &
                     0xfffffffffffffff0) / uVar5);
      auVar31._8_4_ = 0x3f800000;
      auVar31._0_8_ = 0x3f8000003f800000;
      auVar31._12_4_ = 0x3f800000;
      auVar30 = vmovhps_avx(auVar31,*(undefined8 *)
                                     (*(long *)(&this->field_0xe0 + (long)p_Var20) +
                                     (long)((int)*(float *)(*(long *)(&this->field_0x128 +
                                                                     (long)p_Var20) +
                                                            lVar22 * uVar21 * 4 + lVar18 * 4) * 2) *
                                     4));
      for (uVar15 = 0; uVar15 != uVar23; uVar15 = uVar15 + 1) {
        auVar38._0_4_ = (float)(int)uVar15;
        auVar38._4_4_ = auVar38._0_4_;
        auVar38._8_4_ = auVar38._0_4_;
        auVar38._12_4_ = auVar38._0_4_;
        auVar44 = vunpcklpd_avx(auVar38,auVar29);
        for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
          puVar1 = (uint *)((long)pvVar4 +
                           uVar14 * 4 +
                           uVar15 * (long)(int)(undefined4)uVar19 * 4 + (lVar24 + 5) * sVar3 * uVar5
                           );
          p_Var20 = this->_vptr_Yolov3DetectionOutput_x86_avx512[-3];
          auVar55 = ZEXT464(0xff7fffff);
          for (puVar13 = puVar1;
              puVar13 < puVar1 + (int)((*(uint *)(&this->field_0xd0 + (long)p_Var20) & 0xfffffff8) *
                                      iVar27); puVar13 = puVar13 + iVar27 * 8) {
            auVar7 = vpcmpeqd_avx2(auVar47._0_32_,auVar47._0_32_);
            auVar42 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar7);
            auVar7 = vpermpd_avx2(auVar42,0x4e);
            auVar7 = vmaxps_avx(auVar42,auVar7);
            auVar32 = vshufpd_avx(auVar7,auVar7,5);
            auVar7 = vmaxps_avx(auVar7,auVar32);
            auVar32 = vshufps_avx(auVar7,auVar7,0xb1);
            auVar7 = vmaxps_avx(auVar7,auVar32);
            auVar47 = ZEXT3264(auVar7);
            if (auVar55._0_4_ < auVar7._0_4_) {
              uVar48 = vcmpps_avx512vl(auVar42,auVar7,0);
              iVar6 = 0;
              if ((uint)uVar48 != 0) {
                for (; ((uint)uVar48 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                }
              }
              auVar55 = ZEXT1664(auVar7._0_16_);
            }
          }
          for (; puVar13 < puVar1 + (int)(*(uint *)(&this->field_0xd0 + (long)p_Var20) * iVar27);
              puVar13 = puVar13 + iVar27) {
            auVar31 = vmaxss_avx(ZEXT416(*puVar13),auVar55._0_16_);
            auVar55 = ZEXT1664(auVar31);
          }
          fVar33 = expf(-*pfVar26);
          auVar8._8_4_ = 0x80000000;
          auVar8._0_8_ = 0x8000000080000000;
          auVar8._12_4_ = 0x80000000;
          auVar31 = vxorps_avx512vl(auVar55._0_16_,auVar8);
          fVar34 = expf(auVar31._0_4_);
          auVar47 = ZEXT464(0x3f800000);
          auVar31 = vfmadd132ss_fma(ZEXT416((uint)(fVar34 + 1.0)),auVar47._0_16_,
                                    ZEXT416((uint)fVar33));
          fVar33 = 1.0 / auVar31._0_4_;
          if (*(float *)(&this->field_0xd8 + (long)p_Var20) <= fVar33) {
            fVar34 = expf(-*pfVar28);
            auVar9._8_4_ = 0x80000000;
            auVar9._0_8_ = 0x8000000080000000;
            auVar9._12_4_ = 0x80000000;
            auVar31 = vxorps_avx512vl(ZEXT416(*local_198),auVar9);
            fVar35 = expf(auVar31._0_4_);
            fVar36 = expf(*local_1a0);
            auVar47._0_4_ = expf(*local_1a8);
            auVar47._4_60_ = extraout_var;
            auVar31 = vinsertps_avx(ZEXT416((uint)(fVar34 + 1.0)),ZEXT416((uint)(fVar35 + 1.0)),0x10
                                   );
            auVar38 = vrcpps_avx(auVar31);
            auVar53._0_4_ = auVar30._0_4_ * auVar38._0_4_;
            auVar53._4_4_ = auVar30._4_4_ * auVar38._4_4_;
            auVar53._8_4_ = auVar30._8_4_ * auVar38._8_4_;
            auVar53._12_4_ = auVar30._12_4_ * auVar38._12_4_;
            auVar31 = vfmsub213ps_fma(auVar31,auVar53,auVar30);
            auVar8 = vfnmadd213ps_fma(auVar31,auVar38,auVar53);
            auVar49._8_8_ = CONCAT44(extraout_XMM0_Db,fVar36);
            auVar49._0_8_ = CONCAT44(extraout_XMM0_Db,fVar36);
            auVar31 = vinsertps_avx(auVar49,auVar47._0_16_,0x30);
            auVar10._4_8_ = auVar31._8_8_;
            auVar10._0_4_ = auVar30._4_4_ * auVar31._4_4_;
            auVar39._0_8_ = auVar10._0_8_ << 0x20;
            auVar39._8_4_ = auVar30._8_4_ * auVar31._8_4_;
            auVar39._12_4_ = auVar30._12_4_ * auVar31._12_4_;
            auVar40._8_8_ = auVar39._8_8_;
            auVar40._0_8_ = auVar8._0_8_;
            local_190 = (int)uVar14;
            auVar50._0_4_ = (float)local_190;
            auVar50._4_12_ = auVar44._4_12_;
            auVar31 = vrcpps_avx(auVar50);
            auVar54._0_4_ = auVar8._0_4_ * auVar31._0_4_;
            auVar54._4_4_ = auVar8._4_4_ * auVar31._4_4_;
            auVar54._8_4_ = auVar39._8_4_ * auVar31._8_4_;
            auVar54._12_4_ = auVar39._12_4_ * auVar31._12_4_;
            auVar38 = vfmsub231ps_fma(auVar40,auVar50,auVar54);
            auVar9 = vfnmadd213ps_fma(auVar38,auVar31,auVar54);
            local_b8 = auVar43._0_4_;
            fStack_b4 = auVar43._4_4_;
            fStack_b0 = auVar43._8_4_;
            fStack_ac = auVar43._12_4_;
            auVar45._0_4_ = (auVar8._0_4_ + auVar50._0_4_) * local_b8;
            auVar45._4_4_ = (auVar8._4_4_ + auVar44._4_4_) * fStack_b4;
            auVar45._8_4_ = (auVar8._8_4_ + auVar44._8_4_) * fStack_b0;
            auVar45._12_4_ = (auVar8._12_4_ + auVar44._12_4_) * fStack_ac;
            local_a8 = auVar37._0_4_;
            fStack_a4 = auVar37._4_4_;
            auVar51._0_4_ = auVar9._0_4_ * local_a8;
            auVar51._4_4_ = auVar9._4_4_ * fStack_a4;
            auVar51._8_4_ = auVar9._8_4_ * 0.5;
            auVar51._12_4_ = auVar9._12_4_ * 0.5;
            auVar31 = vshufpd_avx(auVar51,auVar45,1);
            auVar38 = vsubps_avx(auVar45,auVar31);
            auVar11._4_8_ = auVar51._8_8_;
            auVar11._0_4_ = auVar51._4_4_ + auVar31._4_4_;
            auVar52._0_8_ = auVar11._0_8_ << 0x20;
            auVar52._8_4_ = auVar51._8_4_ + auVar31._8_4_;
            auVar52._12_4_ = auVar51._12_4_ + auVar31._12_4_;
            auVar46._0_8_ = auVar38._0_8_;
            auVar46._8_8_ = auVar52._8_8_;
            auVar47 = ZEXT1664(auVar46);
            auVar31 = vmovshdup_avx(auVar9);
            auVar41._0_4_ = auVar31._0_4_ * auVar9._0_4_;
            auVar41._4_4_ = auVar31._4_4_ * auVar9._4_4_;
            auVar41._8_4_ = auVar31._8_4_ * auVar9._8_4_;
            auVar41._12_4_ = auVar31._12_4_ * auVar9._12_4_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = auVar38._0_4_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar46._4_8_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = vextractps_avx(auVar41,2);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = fVar33;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = auVar52._12_4_;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar18 * 6),
                        (value_type *)&picked);
          }
          pfVar28 = pfVar28 + 1;
          local_198 = local_198 + 1;
          local_1a0 = local_1a0 + 1;
          local_1a8 = local_1a8 + 1;
          pfVar26 = pfVar26 + 1;
        }
      }
      p_Var20 = this->_vptr_Yolov3DetectionOutput_x86_avx512[-3];
      iVar27 = *(int *)(&this->field_0xd4 + (long)p_Var20);
    }
    lVar22 = 8;
    for (lVar18 = 0; lVar18 < *(int *)(&this->field_0xd4 + (long)p_Var20); lVar18 = lVar18 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar22));
      p_Var20 = this->_vptr_Yolov3DetectionOutput_x86_avx512[-3];
      lVar22 = lVar22 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}